

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialogPrivate::ensureLayout(QInputDialogPrivate *this)

{
  QWidget *parent;
  QDialogButtonBox *pQVar1;
  QLabel *pQVar2;
  QDialogButtonBox *this_00;
  undefined4 *puVar3;
  QLayout *this_01;
  QAbstractSpinBox *spinBox;
  QWidget *buddy;
  long in_FS_OFFSET;
  QObject local_70 [8];
  QSlotObjectBase local_68;
  Connection local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->mainLayout == (QVBoxLayout *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    buddy = this->inputWidget;
    if (buddy == (QWidget *)0x0) {
      ensureLineEdit(this);
      buddy = &this->lineEdit->super_QWidget;
      this->inputWidget = buddy;
    }
    pQVar2 = this->label;
    if (pQVar2 == (QLabel *)0x0) {
      pQVar2 = (QLabel *)operator_new(0x28);
      QMetaObject::tr((char *)&local_50,(char *)&QInputDialog::staticMetaObject,0x6e6bd1);
      QLabel::QLabel(pQVar2,&local_50,parent,(WindowFlags)0x0);
      this->label = pQVar2;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      pQVar2 = this->label;
      buddy = this->inputWidget;
    }
    QLabel::setBuddy(pQVar2,buddy);
    QWidget::setSizePolicy((QWidget *)this->label,(QSizePolicy)0x10000);
    this_00 = (QDialogButtonBox *)operator_new(0x28);
    QDialogButtonBox::QDialogButtonBox(this_00,(StandardButtons)0x400400,Horizontal,parent);
    this->buttonBox = (QDialogButtonBox *)this_00;
    local_68.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1b9;
    local_68._4_4_ = 0;
    local_68.m_impl = (ImplFn)0x0;
    local_50.d.d = (Data *)QDialogButtonBox::accepted;
    local_50.d.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::QCallableObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
    *(undefined8 *)(puVar3 + 4) = 0x1b9;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_58,(void **)this_00,(QObject *)&local_50,(void **)parent,&local_68,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_58);
    pQVar1 = this->buttonBox;
    local_68.m_ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = (QAtomicInteger<int>)0x1c1;
    local_68._4_4_ = 0;
    local_68.m_impl = (ImplFn)0x0;
    local_50.d.d = (Data *)QDialogButtonBox::rejected;
    local_50.d.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::QCallableObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
    *(undefined8 *)(puVar3 + 4) = 0x1c1;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              (local_70,(void **)pQVar1,(QObject *)&local_50,(void **)parent,&local_68,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_70);
    this_01 = (QLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_01,parent);
    this->mainLayout = (QVBoxLayout *)this_01;
    QLayout::setSizeConstraint(this_01,SetMinAndMaxSize);
    QBoxLayout::addWidget
              (&this->mainLayout->super_QBoxLayout,(QWidget *)this->label,0,(Alignment)0x0);
    QBoxLayout::addWidget(&this->mainLayout->super_QBoxLayout,this->inputWidget,0,(Alignment)0x0);
    QBoxLayout::addWidget
              (&this->mainLayout->super_QBoxLayout,&this->buttonBox->super_QWidget,0,(Alignment)0x0)
    ;
    spinBox = (QAbstractSpinBox *)QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    ensureEnabledConnection(this,spinBox);
    QWidget::show(this->inputWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureLayout()
{
    Q_Q(QInputDialog);

    if (mainLayout)
        return;

    if (!inputWidget) {
        ensureLineEdit();
        inputWidget = lineEdit;
    }

    if (!label)
        label = new QLabel(QInputDialog::tr("Enter a value:"), q);
#ifndef QT_NO_SHORTCUT
    label->setBuddy(inputWidget);
#endif
    label->setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);

    buttonBox = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel, Qt::Horizontal, q);
    QObject::connect(buttonBox, &QDialogButtonBox::accepted, q, &QDialog::accept);
    QObject::connect(buttonBox, &QDialogButtonBox::rejected, q, &QDialog::reject);

    mainLayout = new QVBoxLayout(q);
    mainLayout->setSizeConstraint(QLayout::SetMinAndMaxSize);
    mainLayout->addWidget(label);
    mainLayout->addWidget(inputWidget);
    mainLayout->addWidget(buttonBox);
    ensureEnabledConnection(qobject_cast<QAbstractSpinBox *>(inputWidget));
    inputWidget->show();
}